

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O3

QMatrix3x3 *
QOpenGLTextureBlitter::sourceTransform
          (QMatrix3x3 *__return_storage_ptr__,QRectF *subTexture,QSize *textureSize,Origin origin)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float *pfVar7;
  long lVar8;
  int col;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  bool bVar17;
  undefined4 uVar18;
  long lVar16;
  
  dVar1 = subTexture->w;
  iVar3 = (textureSize->wd).m_i;
  iVar4 = (textureSize->ht).m_i;
  dVar11 = subTexture->h;
  dVar2 = subTexture->xp;
  dVar12 = subTexture->yp;
  pfVar7 = __return_storage_ptr__->m[0] + 1;
  __return_storage_ptr__->m[1][2] = -NAN;
  __return_storage_ptr__->m[2][0] = -NAN;
  __return_storage_ptr__->m[2][1] = -NAN;
  __return_storage_ptr__->m[2][2] = -NAN;
  __return_storage_ptr__->m[0][1] = -NAN;
  __return_storage_ptr__->m[0][2] = -NAN;
  __return_storage_ptr__->m[1][0] = -NAN;
  __return_storage_ptr__->m[1][1] = -NAN;
  auVar6 = _DAT_00178230;
  auVar5 = _DAT_00178220;
  lVar8 = 0;
  lVar9 = 0;
  do {
    lVar10 = 0;
    auVar15 = auVar5;
    do {
      bVar17 = SUB164(auVar15 ^ auVar6,4) == -0x80000000 && SUB164(auVar15 ^ auVar6,0) < -0x7ffffffd
      ;
      if (bVar17) {
        uVar18 = 0x3f800000;
        if (lVar8 != lVar10) {
          uVar18 = 0;
        }
        *(undefined4 *)((long)pfVar7 + lVar10 + -4) = uVar18;
      }
      if (bVar17) {
        uVar18 = 0x3f800000;
        if (lVar8 + -4 != lVar10) {
          uVar18 = 0;
        }
        *(undefined4 *)((long)pfVar7 + lVar10) = uVar18;
      }
      lVar16 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar16 + 2;
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x10);
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 4;
    pfVar7 = pfVar7 + 3;
  } while (lVar9 != 3);
  dVar13 = (double)iVar3;
  dVar14 = (double)iVar4;
  dVar12 = dVar12 / dVar14;
  if (origin == OriginTopLeft) {
    dVar12 = 1.0 - dVar12;
  }
  dVar11 = dVar11 / dVar14;
  if (origin == OriginTopLeft) {
    dVar11 = -dVar11;
  }
  *(ulong *)__return_storage_ptr__->m[2] = CONCAT44((float)dVar12,(float)(dVar2 / dVar13));
  __return_storage_ptr__->m[0][0] = (float)(dVar1 / dVar13);
  __return_storage_ptr__->m[1][1] = (float)dVar11;
  return __return_storage_ptr__;
}

Assistant:

QMatrix3x3 QOpenGLTextureBlitter::sourceTransform(const QRectF &subTexture,
                                                  const QSize &textureSize,
                                                  Origin origin)
{
    qreal x_scale = subTexture.width() / textureSize.width();
    qreal y_scale = subTexture.height() / textureSize.height();

    const QPointF topLeft = subTexture.topLeft();
    qreal x_translate = topLeft.x() / textureSize.width();
    qreal y_translate = topLeft.y() / textureSize.height();

    if (origin == OriginTopLeft) {
        y_scale = -y_scale;
        y_translate = 1 - y_translate;
    }

    QMatrix3x3 matrix;
    matrix(0,2) = x_translate;
    matrix(1,2) = y_translate;

    matrix(0,0) = x_scale;
    matrix(1,1) = y_scale;

    return matrix;
}